

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall
server_context::send_error(server_context *this,int id_task,string *error,error_type type)

{
  common_log *log;
  long *plVar1;
  long *__n;
  void *__buf;
  int in_R8D;
  long *local_30;
  
  if (-1 < common_log_verbosity_thold) {
    log = common_log_main();
    in_R8D = 0x27bdf6;
    common_log_add(log,GGML_LOG_LEVEL_ERROR,"srv  %12.*s: task id = %d, error: %s\n",0xc,
                   "send_error",(ulong)(uint)id_task,(error->_M_dataplus)._M_p);
  }
  plVar1 = (long *)operator_new(0x38);
  *plVar1 = 0;
  plVar1[1] = 0;
  plVar1[2] = 0;
  plVar1[3] = 0;
  plVar1[4] = 0;
  plVar1[5] = 0;
  plVar1[6] = 0;
  *plVar1 = (long)&PTR_is_error_002dfbf0;
  plVar1[1] = -1;
  plVar1[2] = 0x200000000;
  __n = plVar1 + 5;
  plVar1[3] = (long)__n;
  plVar1[4] = 0;
  *(undefined1 *)(plVar1 + 5) = 0;
  *(int *)(plVar1 + 1) = id_task;
  *(error_type *)((long)plVar1 + 0x14) = type;
  std::__cxx11::string::_M_assign((string *)(plVar1 + 3));
  local_30 = plVar1;
  server_response::send(&this->queue_results,(int)&local_30,__buf,(size_t)__n,in_R8D);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 0x28))();
  }
  return;
}

Assistant:

void send_error(const int id_task, const std::string & error, const enum error_type type = ERROR_TYPE_SERVER) {
        SRV_ERR("task id = %d, error: %s\n", id_task, error.c_str());

        auto res = std::make_unique<server_task_result_error>();
        res->id       = id_task;
        res->err_type = type;
        res->err_msg  = error;

        queue_results.send(std::move(res));
    }